

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_base.hpp
# Opt level: O1

bool __thiscall
boost::spirit::qi::
sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::a...oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>,boost::fusion::nil_>>>
::
parse_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
          (sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::lazy_parser<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::equal_to,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::qi::action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::a___oto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>_boost__fusion__nil_>>>
           *this,undefined8 *first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *last,unused_type *context,unused_type *skipper,unused_type *attr_)

{
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iter;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_10;
  
  local_10._M_current = (uchar *)*first;
  bVar1 = true;
  if (*(uint *)(this + 0x10) == (uint)**(byte **)(this + 8)) {
    bVar1 = action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>
            ::
            parse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
                      ((action<boost::spirit::qi::any_binary_parser<boost::spirit::qi::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>>
                        *)(this + 0x20),&local_10,last,context,skipper,attr_);
    bVar1 = !bVar1;
  }
  if (bVar1 == false) {
    *first = local_10._M_current;
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool parse_impl(Iterator& first, Iterator const& last
          , Context& context, Skipper const& skipper
          , Attribute& attr_, mpl::false_) const
        {
            Iterator iter = first;
            typedef traits::attribute_not_unused<Context, Iterator> predicate;

            // wrap the attribute in a tuple if it is not a tuple or if the 
            // attribute of this sequence is a single element tuple
            typedef typename attribute<Context, Iterator>::type_ attr_type_;
            typename traits::wrap_if_not_tuple<Attribute
              , typename mpl::and_<
                    traits::one_element_sequence<attr_type_>
                  , mpl::not_<traits::one_element_sequence<Attribute> >
                >::type
            >::type attr_local(attr_);

            // return false if *any* of the parsers fail
            if (spirit::any_if(elements, attr_local
              , Derived::fail_function(iter, last, context, skipper), predicate()))
                return false;
            first = iter;
            return true;
        }